

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
getLocalOptionValues
          (HighsLogOptions *report_log_options,string *option,
          vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
          string *current_value,string *default_value)

{
  HighsOptionType type;
  pointer pcVar1;
  OptionStatus OVar2;
  OptionStatus OVar3;
  HighsInt index;
  int local_54;
  string local_50;
  
  OVar2 = getOptionIndex(report_log_options,option,option_records,&local_54);
  OVar3 = kUnknownOption;
  if (OVar2 == kOk) {
    type = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
           _M_impl.super__Vector_impl_data._M_start[local_54]->type;
    if (type == kString) {
      if (current_value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)current_value);
      }
      OVar3 = kOk;
      if (default_value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)default_value);
        OVar3 = kOk;
      }
    }
    else {
      pcVar1 = (option->_M_dataplus)._M_p;
      optionEntryTypeToString_abi_cxx11_(&local_50,type);
      highsLogUser(report_log_options,kError,
                   "getLocalOptionValue: Option \"%s\" requires value of type %s, not string\n",
                   pcVar1,local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      OVar3 = kIllegalValue;
    }
  }
  return OVar3;
}

Assistant:

OptionStatus getLocalOptionValues(
    const HighsLogOptions& report_log_options, const std::string& option,
    const std::vector<OptionRecord*>& option_records,
    std::string* current_value, std::string* default_value) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, option, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kString) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "getLocalOptionValue: Option \"%s\" requires value of type "
                 "%s, not string\n",
                 option.c_str(), optionEntryTypeToString(type).c_str());
    return OptionStatus::kIllegalValue;
  }
  OptionRecordString& option_record =
      ((OptionRecordString*)option_records[index])[0];
  if (current_value) *current_value = *(option_record.value);
  if (default_value) *default_value = option_record.default_value;
  return OptionStatus::kOk;
}